

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_write_extensions(znzFile fp,nifti_image *nim)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  uint local_34;
  int ok;
  int size;
  int c;
  char extdr [4];
  nifti1_extension *list;
  nifti_image *nim_local;
  znzFile fp_local;
  
  memset(&size,0,4);
  if (((fp == (znzFile)0x0) || (nim == (nifti_image *)0x0)) || (nim->num_ext < 0)) {
    if (0 < g_opts.debug) {
      fprintf(_stderr,"** nifti_write_extensions, bad params\n");
    }
    fp_local._4_4_ = -1;
  }
  else if ((g_opts.skip_blank_ext == 0) ||
          ((nim->num_ext != 0 && (nim->ext_list != (nifti1_extension *)0x0)))) {
    iVar1 = valid_nifti_extensions(nim);
    if (iVar1 == 0) {
      nim->num_ext = 0;
    }
    if (0 < nim->num_ext) {
      size._0_1_ = 1;
    }
    sVar2 = nifti_write_buffer(fp,&size,4);
    if (sVar2 == 4) {
      _c = nim->ext_list;
      for (ok = 0; ok < nim->num_ext; ok = ok + 1) {
        sVar2 = nifti_write_buffer(fp,_c,4);
        local_34 = (uint)sVar2;
        bVar3 = local_34 == 4;
        if (bVar3) {
          sVar2 = nifti_write_buffer(fp,&_c->ecode,4);
          local_34 = (uint)sVar2;
          bVar3 = local_34 == 4;
        }
        if (bVar3) {
          sVar2 = nifti_write_buffer(fp,_c->edata,(long)(_c->esize + -8));
          local_34 = (uint)sVar2;
          bVar3 = local_34 == _c->esize - 8U;
        }
        if (!bVar3) {
          fprintf(_stderr,"** failed while writing extension #%d\n",(ulong)(uint)ok);
          return -1;
        }
        if (2 < g_opts.debug) {
          fprintf(_stderr,"+d wrote extension %d of %d bytes\n",(ulong)(uint)ok,(ulong)local_34);
        }
        _c = _c + 1;
      }
      if (1 < g_opts.debug) {
        fprintf(_stderr,"+d wrote out %d extension(s)\n",(ulong)(uint)nim->num_ext);
      }
      fp_local._4_4_ = nim->num_ext;
    }
    else {
      fprintf(_stderr,"** failed to write extender\n");
      fp_local._4_4_ = -1;
    }
  }
  else {
    if (1 < g_opts.debug) {
      fprintf(_stderr,"-d no exts and skip_blank_ext set, so skipping 4-byte extender\n");
    }
    fp_local._4_4_ = 0;
  }
  return fp_local._4_4_;
}

Assistant:

static int nifti_write_extensions(znzFile fp, nifti_image *nim)
{
   nifti1_extension * list;
   char               extdr[4] = { 0, 0, 0, 0 };
   int                c, size, ok = 1;

   if( znz_isnull(fp) || !nim || nim->num_ext < 0 ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** nifti_write_extensions, bad params\n");
      return -1;
   }

   /* if no extensions and user requests it, skip extender */
   if( g_opts.skip_blank_ext && (nim->num_ext == 0 || ! nim->ext_list ) ){
      if( g_opts.debug > 1 )
         fprintf(stderr,"-d no exts and skip_blank_ext set, "
                        "so skipping 4-byte extender\n");
      return 0;
   }

   /* if invalid extension list, clear num_ext */
   if( ! valid_nifti_extensions(nim) ) nim->num_ext = 0;

   /* write out extender block */
   if( nim->num_ext > 0 ) extdr[0] = 1;
   if( nifti_write_buffer(fp, extdr, 4) != 4 ){
      fprintf(stderr,"** failed to write extender\n");
      return -1;
   }

   list = nim->ext_list;
   for ( c = 0; c < nim->num_ext; c++ ){
      size = (int)nifti_write_buffer(fp, &list->esize, sizeof(int));
      ok = (size == (int)sizeof(int));
      if( ok ){
         size = (int)nifti_write_buffer(fp, &list->ecode, sizeof(int));
         ok = (size == (int)sizeof(int));
      }
      if( ok ){
         size = (int)nifti_write_buffer(fp, list->edata, list->esize - 8);
         ok = (size == list->esize - 8);
      }

      if( !ok ){
         fprintf(stderr,"** failed while writing extension #%d\n",c);
         return -1;
      } else if ( g_opts.debug > 2 )
         fprintf(stderr,"+d wrote extension %d of %d bytes\n", c, size);

      list++;
   }

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d wrote out %d extension(s)\n", nim->num_ext);

   return nim->num_ext;
}